

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O2

int __thiscall sc_core::sc_plist_base::remove(sc_plist_base *this,char *__filename)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  void *pvVar4;
  
  if (this->head == (handle_t)__filename) {
    pvVar4 = pop_front(this);
    return (int)pvVar4;
  }
  if (this->tail != (handle_t)__filename) {
    lVar1 = *(long *)(__filename + 0x10);
    uVar2 = *(undefined8 *)__filename;
    lVar3 = *(long *)(__filename + 8);
    *(long *)(lVar3 + 0x10) = lVar1;
    *(long *)(lVar1 + 8) = lVar3;
    sc_mempool::release(__filename,0x18);
    return (int)uVar2;
  }
  pvVar4 = pop_back(this);
  return (int)pvVar4;
}

Assistant:

void*
sc_plist_base::remove( handle_t h )
{
    if (h == head)
        return pop_front();
    else if (h == tail)
        return pop_back();
    else {
        void* d = h->data;
        h->prev->next = h->next;
        h->next->prev = h->prev;
        delete h;
        return d;
    }
}